

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O3

string * __thiscall
t_perl_generator::get_namespace_out_dir_abi_cxx11_
          (string *__return_storage_ptr__,t_perl_generator *this)

{
  _List_node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  local_48._M_impl._M_node._M_size = 0;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
  perl_namespace_dirs(this,(this->super_t_oop_generator).super_t_generator.program_,
                      (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_48);
  if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var1 = local_48._M_impl._M_node.super__List_node_base._M_next;
    do {
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,p_Var1[1]._M_next,
                 (long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var1[1]._M_next);
      std::__cxx11::string::append((char *)local_68);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68[0]);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0]);
      }
      p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var1 != (_List_node_base *)&local_48);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string get_namespace_out_dir() {
    std::string outdir = get_out_dir();
    std::list<std::string> dirs;
    perl_namespace_dirs(program_, dirs);
    std::list<std::string>::iterator it;
    for (it = dirs.begin(); it != dirs.end(); it++) {
      outdir += *it + "/";
    }
    return outdir;
  }